

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigFanout.c
# Opt level: O1

void Aig_ObjAddFanout(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pFanout)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  long lVar5;
  uint uVar6;
  uint *puVar7;
  int iVar8;
  uint *puVar9;
  
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                  ,0x6e,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if ((((uint)pFanout | (uint)pObj) & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj) && !Aig_IsComplement(pFanout)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                  ,0x6f,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar8 = pFanout->Id;
  if (iVar8 < 1) {
    __assert_fail("pFanout->Id > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                  ,0x70,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar2 = pObj->Id;
  if (p->nFansAlloc <= iVar2 || p->nFansAlloc <= iVar8) {
    if (iVar8 < iVar2) {
      iVar8 = iVar2;
    }
    piVar4 = (int *)realloc(p->pFanData,(ulong)(uint)(iVar8 * 10) << 2);
    p->pFanData = piVar4;
    memset(piVar4 + (long)p->nFansAlloc * 5,0,((long)iVar8 * 2 - (long)p->nFansAlloc) * 0x14);
    p->nFansAlloc = (int)((long)iVar8 * 2);
  }
  lVar5 = (long)pObj->Id;
  if ((pObj->Id < p->nFansAlloc) && (iVar8 = pFanout->Id, iVar8 < p->nFansAlloc)) {
    if ((Aig_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe) == pObj) {
      uVar6 = 0;
    }
    else {
      uVar6 = 1;
      if ((Aig_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe) != pObj) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x150,"int Aig_ObjWhatFanin(Aig_Obj_t *, Aig_Obj_t *)");
      }
    }
    uVar1 = uVar6 + iVar8 * 2;
    piVar4 = p->pFanData;
    iVar8 = iVar8 * 2 >> 1;
    puVar9 = (uint *)(piVar4 + (long)(iVar8 * 5) + (ulong)uVar6 + 1);
    puVar7 = (uint *)(piVar4 + (long)(iVar8 * 5) + (ulong)uVar6 + 3);
    uVar6 = piVar4[lVar5 * 5];
    if (uVar6 == 0) {
      piVar4[lVar5 * 5] = uVar1;
    }
    else {
      uVar3 = piVar4[(long)(((int)uVar6 >> 1) * 5) + (ulong)(uVar6 & 1) + 1];
      if (piVar4[(long)(((int)uVar3 >> 1) * 5) + (ulong)(uVar3 & 1) + 3] != uVar6) {
        __assert_fail("*pNext == *pFirst",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                      ,0x87,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      *puVar9 = uVar3;
      puVar9 = (uint *)(piVar4 + (long)(((int)uVar6 >> 1) * 5) + (ulong)(uVar6 & 1) + 1);
      *puVar7 = piVar4[lVar5 * 5];
      puVar7 = (uint *)(piVar4 + (long)(((int)uVar3 >> 1) * 5) + (ulong)(uVar3 & 1) + 3);
    }
    *puVar9 = uVar1;
    *puVar7 = uVar1;
    return;
  }
  __assert_fail("pObj->Id < p->nFansAlloc && pFanout->Id < p->nFansAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                ,0x78,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_ObjAddFanout( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pFanout )
{
    int iFan, * pFirst, * pPrevC, * pNextC, * pPrev, * pNext;
    assert( p->pFanData );
    assert( !Aig_IsComplement(pObj) && !Aig_IsComplement(pFanout) );
    assert( pFanout->Id > 0 );
    if ( pObj->Id >= p->nFansAlloc || pFanout->Id >= p->nFansAlloc )
    {
        int nFansAlloc = 2 * Abc_MaxInt( pObj->Id, pFanout->Id ); 
        p->pFanData = ABC_REALLOC( int, p->pFanData, 5 * nFansAlloc );
        memset( p->pFanData + 5 * p->nFansAlloc, 0, sizeof(int) * 5 * (nFansAlloc - p->nFansAlloc) );
        p->nFansAlloc = nFansAlloc;
    }
    assert( pObj->Id < p->nFansAlloc && pFanout->Id < p->nFansAlloc );
    iFan   = Aig_FanoutCreate( pFanout->Id, Aig_ObjWhatFanin(pFanout, pObj) );
    pPrevC = Aig_FanoutPrev( p->pFanData, iFan );
    pNextC = Aig_FanoutNext( p->pFanData, iFan );
    pFirst = Aig_FanoutObj( p->pFanData, pObj->Id );
    if ( *pFirst == 0 )
    {
        *pFirst = iFan;
        *pPrevC = iFan;
        *pNextC = iFan;
    }
    else
    {
        pPrev = Aig_FanoutPrev( p->pFanData, *pFirst );
        pNext = Aig_FanoutNext( p->pFanData, *pPrev );
        assert( *pNext == *pFirst );
        *pPrevC = *pPrev;
        *pNextC = *pFirst;
        *pPrev  = iFan;
        *pNext  = iFan;
    }
}